

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  string *psVar1;
  size_t __n;
  int iVar2;
  LinkClosure *pLVar3;
  string *li;
  string *lang;
  
  pLVar3 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  psVar1 = (pLVar3->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (lang = (pLVar3->Languages).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; lang != psVar1; lang = lang + 1) {
    iVar2 = std::__cxx11::string::compare((char *)lang);
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)lang), iVar2 == 0)) {
      AddRuntimeLinkLibrary(this,lang);
    }
    __n = lang->_M_string_length;
    if ((__n != (this->LinkLanguage)._M_string_length) ||
       ((__n != 0 &&
        (iVar2 = bcmp((lang->_M_dataplus)._M_p,(this->LinkLanguage)._M_dataplus._M_p,__n),
        iVar2 != 0)))) {
      AddImplicitLinkInfo(this,lang);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for (std::string const& li : lc->Languages) {

    if (li == "CUDA" || li == "HIP") {
      // These need to go before the other implicit link information
      // as they could require symbols from those other library
      // Currently restricted as CUDA and HIP are the only languages
      // we have documented runtime behavior controls for
      this->AddRuntimeLinkLibrary(li);
    }

    // Skip those of the linker language.  They are implicit.
    if (li != this->LinkLanguage) {
      this->AddImplicitLinkInfo(li);
    }
  }
}